

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void __thiscall CodeGenGenericContext::KillUnreadRegisters(CodeGenGenericContext *this)

{
  uint i;
  x86Reg reg;
  x86XmmReg reg_00;
  
  for (reg = rNONE; reg != rRegCount; reg = reg + rEAX) {
    KillRegister(this,reg);
  }
  for (reg_00 = rXMM0; reg_00 != rXmmRegCount; reg_00 = reg_00 + rXMM1) {
    KillRegister(this,reg_00);
  }
  return;
}

Assistant:

void CodeGenGenericContext::KillUnreadRegisters()
{
	for(unsigned i = 0; i < rRegCount; i++)
		KillRegister(x86Reg(i));

	for(unsigned i = 0; i < rXmmRegCount; i++)
		KillRegister(x86XmmReg(i));
}